

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_decoder.c
# Opt level: O0

aom_codec_err_t aom_codec_decode(aom_codec_ctx_t *ctx,uint8_t *data,size_t data_sz,void *user_priv)

{
  aom_codec_decode_fn_t_conflict p_Var1;
  aom_codec_alg_priv_t_conflict *paVar2;
  void *in_RCX;
  size_t in_RDX;
  uint8_t *in_RSI;
  aom_codec_ctx_t *in_RDI;
  aom_codec_err_t res;
  aom_codec_err_t local_24;
  
  if (in_RDI == (aom_codec_ctx_t *)0x0) {
    local_24 = AOM_CODEC_INVALID_PARAM;
  }
  else if ((in_RDI->iface == (aom_codec_iface_t *)0x0) || (in_RDI->priv == (aom_codec_priv_t *)0x0))
  {
    local_24 = AOM_CODEC_ERROR;
  }
  else {
    p_Var1 = (in_RDI->iface->dec).decode;
    paVar2 = (aom_codec_alg_priv_t_conflict *)get_alg_priv(in_RDI);
    local_24 = (*p_Var1)(paVar2,in_RSI,in_RDX,in_RCX);
  }
  if (in_RDI != (aom_codec_ctx_t *)0x0) {
    in_RDI->err = local_24;
  }
  return local_24;
}

Assistant:

aom_codec_err_t aom_codec_decode(aom_codec_ctx_t *ctx, const uint8_t *data,
                                 size_t data_sz, void *user_priv) {
  aom_codec_err_t res;

  if (!ctx)
    res = AOM_CODEC_INVALID_PARAM;
  else if (!ctx->iface || !ctx->priv)
    res = AOM_CODEC_ERROR;
  else {
    res = ctx->iface->dec.decode(get_alg_priv(ctx), data, data_sz, user_priv);
  }

  return SAVE_STATUS(ctx, res);
}